

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genData.hpp
# Opt level: O2

pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *
genPointPair<double>
          (pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
           *__return_storage_ptr__,Matrix<double,_4,_4,_0,_4,_4> *T)

{
  RandomReturnType local_8b;
  undefined1 local_88 [16];
  scalar_constant_op<double> local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  Matrix<double,_4,_1,_0,_4,_1> Q;
  Matrix<double,_3,_1,_0,_3,_1> P;
  
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Random(&local_8b,3);
  Q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]._0_4_ =
       0x28;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_88,
              (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
               *)&local_8b,(int *)&Q);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&P,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)local_88);
  local_88._0_8_ = T;
  local_88._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&P;
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Homogeneous<Eigen::Matrix<double,3,1,0,3,1>,0>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&Q,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Homogeneous<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_0>_>
              *)local_88);
  local_78.m_other =
       (double)CONCAT44(Q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array[0]._4_4_,
                        Q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array[0]._0_4_);
  dStack_70 = Q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
              [1];
  local_68 = Q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
             [2];
  dStack_60 = Q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
              [3];
  local_88._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&P;
  std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::
  pair<Eigen::Homogeneous<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_true>
            (__return_storage_ptr__,
             (pair<Eigen::Homogeneous<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
              *)local_88);
  return __return_storage_ptr__;
}

Assistant:

std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>> genPointPair(Eigen::Matrix<floatPrec,4,4> T){
    
    // get a random 3D point (in homogenous coordinates)
    Eigen::Matrix<floatPrec,3,1> P = Eigen::Matrix<floatPrec, 3, 1>::Random(3) * int(POINTSWITHINCUBE);
    // requires as input the pose between the two 3D scans,
    // to apply the respective transformation to the
    // point in RefB
    
    Eigen::Matrix<floatPrec,4,1> Q = T * P.homogeneous();

    return std::make_pair(P.homogeneous(),Q);
}